

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime __thiscall QDate::endOfDay(QDate *this,QTimeZone *zone)

{
  int iVar1;
  char16_t **this_00;
  long lVar2;
  ulong uVar3;
  QDateTime QVar4;
  bool bVar5;
  QTime time;
  Data DVar6;
  QDate QVar7;
  Data DVar8;
  Data DVar9;
  Data DVar10;
  Data DVar11;
  ulong uVar12;
  Data DVar13;
  QDate QVar14;
  time_t tVar15;
  Data DVar16;
  QDate QVar17;
  Data DVar18;
  Data DVar19;
  QTimeZone *in_RDX;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  Data local_b8;
  QTime local_b0;
  QTime local_ac;
  QDateTime when;
  QTime local_9c;
  QDateTime probe_1;
  QTime local_8c;
  QTime local_88;
  QTime local_84;
  QDateTime probe;
  QTime local_74;
  QDateTime when_1;
  OffsetData tran;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1 *)0x31b5d43afe < (undefined1 *)((long)&(zone->d).d[0x9f11b8cc].m_id.d.d + 4U)) ||
     (bVar5 = QTimeZone::isValid(in_RDX), !bVar5)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
    goto LAB_0030b91b;
  }
  when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QVar7.jd = *(qint64 *)&(zone->d).s;
  QTime::QTime(&local_ac,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime(&when,QVar7,local_ac,in_RDX,RelativeToAfter);
  DVar6 = when.d;
  if (((ulong)when.d & 1) == 0) {
    DVar6._4_4_ = 0;
    DVar6._0_4_ = *(uint *)((long)when.d + 4);
  }
  if ((((ulong)DVar6.d & 8) == 0) ||
     (QVar7 = QDateTime::date(&when), (QTimeZonePrivate *)QVar7.jd != (zone->d).d)) {
    if (((-*(int *)&in_RDX->d & 3U) != 0) || (bVar5 = QTimeZone::hasTransitions(in_RDX), !bVar5)) {
LAB_0030b4c4:
      QVar7.jd = (qint64)(zone->d).d;
      this_00 = &tran.abbreviation.d.ptr;
      tran.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      tran.abbreviation.d.d = (Data *)QVar7.jd;
      QTimeZone::QTimeZone((QTimeZone *)this_00,in_RDX);
      when_1.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      QTime::QTime(&local_74,0x15,0x3b,0x3b,999);
      QVar17.jd = (qint64)tran.abbreviation.d.d;
      QDateTime::QDateTime
                (&when_1,(QDate)tran.abbreviation.d.d,local_74,(QTimeZone *)this_00,Reject);
      DVar9 = when_1.d;
      if (((ulong)when_1.d & 1) == 0) {
        DVar9._4_4_ = 0;
        DVar9._0_4_ = *(uint *)((long)when_1.d + 4);
      }
      if (((ulong)DVar9.d & 8) == 0) {
        QTime::QTime(&local_84,0xc,0,0,0);
        QVar17.jd = (qint64)tran.abbreviation.d.d;
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,local_84,(QTimeZone *)this_00,Reject);
        QVar4 = when_1;
        when_1 = probe;
        probe = QVar4;
        QDateTime::~QDateTime(&probe);
        DVar10 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar10._4_4_ = 0;
          DVar10._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar10.d & 8) != 0) goto LAB_0030b5f4;
        QTime::QTime(&local_88,0,0,0,0);
        QVar17.jd = (qint64)tran.abbreviation.d.d;
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,local_88,
                   (QTimeZone *)&tran.abbreviation.d.ptr,Reject);
        QVar4 = when_1;
        when_1 = probe;
        probe = QVar4;
        QDateTime::~QDateTime(&probe);
        DVar11 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar11._4_4_ = 0;
          DVar11._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar11.d & 8) != 0) goto LAB_0030b5f4;
LAB_0030b755:
        QDateTime::QDateTime((QDateTime *)&local_b8.data);
      }
      else {
LAB_0030b5f4:
        uVar12 = QDateTime::time(&when_1,(time_t *)QVar17.jd);
        uVar24 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / 60000 &
                 0xffffffff;
        uVar12 = 0x5a0;
        while( true ) {
          iVar22 = (int)uVar24;
          iVar23 = (int)uVar12;
          if (iVar23 <= iVar22 + 1) break;
          uVar3 = (long)(iVar23 + iVar22) / 2;
          uVar21 = uVar3 & 0xffffffff;
          probe.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
          QTime::QTime(&local_8c,(iVar23 + iVar22) / 0x78,
                       (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar21) % 0x3c),0x3b
                       ,999);
          QVar17.jd = QVar7.jd;
          QDateTime::QDateTime((QDateTime *)&probe.d.data,QVar7,local_8c,in_RDX,PreferAfter);
          DVar13 = probe.d;
          if (((ulong)probe.d & 1) == 0) {
            DVar13._4_4_ = 0;
            DVar13._0_4_ = *(uint *)((long)probe.d + 4);
          }
          if ((((ulong)DVar13.d & 8) != 0) &&
             (QVar14 = QDateTime::date((QDateTime *)&probe.d.data), QVar14.jd == QVar7.jd)) {
            QVar17.jd = (qint64)&probe.d;
            QDateTime::Data::operator=((Data *)&when_1,&probe.d);
            uVar24 = uVar3 & 0xffffffff;
            uVar21 = uVar12;
          }
          QDateTime::~QDateTime((QDateTime *)&probe.d.data);
          uVar12 = uVar21;
        }
        probe.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        tVar15 = QDateTime::time(&when_1,(time_t *)QVar17.jd);
        probe_1.d._0_4_ = (int)tVar15;
        time = QTime::addMSecs((QTime *)&probe_1,1000);
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,time,(QTimeZone *)&tran.abbreviation.d.ptr,
                   Reject);
        DVar16 = probe.d;
        if (((ulong)probe.d & 1) == 0) {
          DVar16._4_4_ = 0;
          DVar16._0_4_ = *(uint *)((long)probe.d + 4);
        }
        if ((((ulong)DVar16.d & 8) != 0) &&
           (QVar17 = QDateTime::date(&probe), QVar17.jd == QVar7.jd)) {
          iVar23 = iVar23 * 0x3c;
          iVar22 = iVar22 * 0x3c;
          while (iVar22 + 1 < iVar23) {
            iVar1 = iVar23 + iVar22;
            probe_1.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
            iVar20 = (int)((long)iVar1 / 2);
            QTime::QTime(&local_9c,iVar1 / 0x1c20,
                         (int)((long)((ulong)(uint)((int)((long)iVar1 / 0x78) >> 0x1f) << 0x20 |
                                     (long)iVar1 / 0x78 & 0xffffffffU) % 0x3c),
                         (int)((long)((ulong)(uint)(iVar20 >> 0x1f) << 0x20 |
                                     (long)iVar1 / 2 & 0xffffffffU) % 0x3c),999);
            QDateTime::QDateTime
                      ((QDateTime *)&probe_1.d.data,(QDate)tran.abbreviation.d.d,local_9c,
                       (QTimeZone *)&tran.abbreviation.d.ptr,Reject);
            DVar19 = probe_1.d;
            if (((ulong)probe_1.d & 1) == 0) {
              DVar19._4_4_ = 0;
              DVar19._0_4_ = *(uint *)((long)probe_1.d + 4);
            }
            if ((((ulong)DVar19.d & 8) != 0) &&
               (QVar17 = QDateTime::date((QDateTime *)&probe_1.d.data), QVar17.jd == QVar7.jd)) {
              QDateTime::Data::operator=((Data *)&when_1,&probe_1.d);
              iVar22 = iVar20;
              iVar20 = iVar23;
            }
            iVar23 = iVar20;
            QDateTime::~QDateTime((QDateTime *)&probe_1.d.data);
          }
        }
        QDateTime::~QDateTime(&probe);
        DVar18 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar18._4_4_ = 0;
          DVar18._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar18.d & 8) == 0) goto LAB_0030b755;
        QDateTime::QDateTime((QDateTime *)&local_b8.data,&when_1);
      }
      QDateTime::~QDateTime(&when_1);
      QTimeZone::~QTimeZone((QTimeZone *)&tran.abbreviation.d.ptr);
      QVar4 = when;
      when.d = (Data)(Data)local_b8.data;
      local_b8 = QVar4.d;
      QDateTime::~QDateTime((QDateTime *)&local_b8.data);
      goto LAB_0030b363;
    }
    tran._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    tran.atUtc.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar7 = addDays((QDate *)zone,-1);
    QTime::QTime(&local_b0,0xc,0,0,0);
    QDateTime::QDateTime(&when_1,QVar7,local_b0,in_RDX,LegacyBehavior);
    QTimeZone::nextTransition(&tran,in_RDX,&when_1);
    QDateTime::~QDateTime(&when_1);
    QDateTime::toTimeZone(&when_1,(QTimeZone *)&tran.atUtc);
    DVar8 = when_1.d;
    if (((ulong)when_1.d & 1) == 0) {
      DVar8._4_4_ = 0;
      DVar8._0_4_ = *(uint *)((long)when_1.d + 4);
    }
    if ((((ulong)DVar8.d & 8) == 0) ||
       (QVar7 = QDateTime::date(&when_1), (QTimeZonePrivate *)QVar7.jd != (zone->d).d)) {
      QDateTime::~QDateTime(&when_1);
      QTimeZone::OffsetData::~OffsetData(&tran);
      goto LAB_0030b4c4;
    }
    QDateTime::QDateTime((QDateTime *)this,&when_1);
    QDateTime::~QDateTime(&when_1);
    QTimeZone::OffsetData::~OffsetData(&tran);
  }
  else {
LAB_0030b363:
    QDateTime::QDateTime((QDateTime *)this,&when);
  }
  QDateTime::~QDateTime(&when);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDateTime)(Data)this;
  }
LAB_0030b91b:
  __stack_chk_fail();
}

Assistant:

QDateTime QDate::endOfDay(const QTimeZone &zone) const
{
    if (!inDateTimeRange(jd, DaySide::End) || !zone.isValid())
        return QDateTime();

    QDateTime when(*this, QTime(23, 59, 59, 999), zone,
                   QDateTime::TransitionResolution::RelativeToAfter);
    if (Q_UNLIKELY(!when.isValid() || when.date() != *this)) {
#if QT_CONFIG(timezone)
        // The end of the day must have fallen in a spring-forward's gap; find the spring-forward:
        if (zone.timeSpec() == Qt::TimeZone && zone.hasTransitions()) {
            QTimeZone::OffsetData tran
                // It's unlikely there's been another transition since yesterday noon.
                // However, the whole of today may have been skipped !
                = zone.nextTransition(QDateTime(addDays(-1), QTime(12, 0), zone));
            const QDateTime &at = tran.atUtc.toTimeZone(zone);
            if (at.isValid() && at.date() == *this)
                return at;
        }
#endif

        when = toLatest(*this, zone);
    }
    return when;
}